

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O3

Float pbrt::Turbulence(Point3f *p,Vector3f *dpdx,Vector3f *dpdy,Float omega,int maxOctaves)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 extraout_var [60];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 auVar19 [12];
  undefined1 in_ZMM6 [64];
  undefined1 local_38 [16];
  undefined1 extraout_var_00 [60];
  
  auVar19 = in_ZMM6._4_12_;
  fVar1 = (dpdx->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar2 = (dpdy->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar10 = ZEXT416((uint)(dpdx->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar10,auVar10);
  auVar10 = ZEXT416((uint)(dpdy->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),auVar10,auVar10);
  auVar14 = ZEXT416((uint)(dpdy->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar10 = vfmadd213ss_fma(auVar14,auVar14,auVar10);
  auVar14 = ZEXT416((uint)(dpdx->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar6 = vfmadd213ss_fma(auVar14,auVar14,auVar6);
  auVar10 = vmaxss_avx(auVar10,auVar6);
  fVar12 = logf(auVar10._0_4_);
  fVar1 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  fVar2 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  fVar3 = (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf000000),0),ZEXT416((uint)(fVar12 * 1.442695)),
                           ZEXT416(0xbf800000));
  auVar14._0_4_ = (float)maxOctaves;
  auVar14._4_12_ = auVar19;
  auVar10 = vminss_avx(auVar14,auVar6);
  uVar13 = vcmpss_avx512f(auVar6,ZEXT416(0) << 0x20,1);
  fVar5 = (float)((uint)!(bool)((byte)uVar13 & 1) * auVar10._0_4_);
  auVar10._0_4_ = fVar5;
  auVar10 = vroundss_avx(auVar10,auVar10,9);
  iVar8 = (int)auVar10._0_4_;
  fVar18 = 1.0;
  fVar12 = 1.0;
  local_38._0_8_ = 0;
  local_38._8_8_ = 0;
  uVar13 = 0;
  if (0 < iVar8) {
    fVar18 = 1.0;
    iVar9 = iVar8;
    fVar12 = fVar18;
    do {
      auVar17._0_4_ = Noise(fVar12 * fVar1,fVar12 * fVar2,fVar12 * fVar3);
      auVar17._4_60_ = extraout_var;
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar10 = vandps_avx512vl(auVar17._0_16_,auVar6);
      iVar9 = iVar9 + -1;
      fVar12 = fVar12 * 1.99;
      auVar10 = vfmadd231ss_fma(local_38,ZEXT416((uint)fVar18),auVar10);
      fVar18 = fVar18 * omega;
      local_38._0_8_ = auVar10._0_8_;
      local_38._8_8_ = auVar10._8_8_;
      uVar13 = local_38._0_8_;
    } while (iVar9 != 0);
  }
  auVar15._0_4_ = ((fVar5 - (float)iVar8) + -0.3) / 0.39999998;
  auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
  uVar4 = vcmpss_avx512f(auVar15,ZEXT816(0) << 0x20,1);
  fVar5 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar10._0_4_);
  auVar11._4_12_ = auVar10._4_12_;
  auVar11._0_4_ = fVar5;
  auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar11,ZEXT416(0x40400000));
  fVar5 = fVar5 * fVar5 * auVar10._0_4_;
  auVar16._0_4_ = Noise(fVar12 * fVar1,fVar12 * fVar2,fVar12 * fVar3);
  auVar16._4_60_ = extraout_var_00;
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar16._0_16_,auVar7);
  iVar9 = maxOctaves - iVar8;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * auVar10._0_4_)),ZEXT416((uint)(1.0 - fVar5)),
                            ZEXT416(0x3e4ccccd));
  local_38._0_4_ = (undefined4)uVar13;
  auVar10 = vfmadd213ss_fma(auVar10,ZEXT416((uint)fVar18),ZEXT416((uint)local_38._0_4_));
  auVar17 = ZEXT1664(auVar10);
  if (iVar9 != 0 && iVar8 <= maxOctaves) {
    do {
      auVar10 = vfmadd231ss_fma(auVar17._0_16_,ZEXT416((uint)fVar18),SUB6416(ZEXT464(0x3e4ccccd),0))
      ;
      auVar17 = ZEXT1664(auVar10);
      fVar18 = fVar18 * omega;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  return auVar17._0_4_;
}

Assistant:

Float Turbulence(const Point3f &p, const Vector3f &dpdx, const Vector3f &dpdy,
                 Float omega, int maxOctaves) {
    // Compute number of octaves for antialiased FBm
    Float len2 = std::max(LengthSquared(dpdx), LengthSquared(dpdy));
    Float n = Clamp(-1 - .5f * Log2(len2), 0, maxOctaves);
    int nInt = std::floor(n);

    // Compute sum of octaves of noise for turbulence
    Float sum = 0, lambda = 1, o = 1;
    for (int i = 0; i < nInt; ++i) {
        sum += o * std::abs(Noise(lambda * p));
        lambda *= 1.99f;
        o *= omega;
    }

    // Account for contributions of clamped octaves in turbulence
    Float nPartial = n - nInt;
    sum += o * Lerp(SmoothStep(nPartial, .3f, .7f), 0.2, std::abs(Noise(lambda * p)));
    for (int i = nInt; i < maxOctaves; ++i) {
        sum += o * 0.2f;
        o *= omega;
    }

    return sum;
}